

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  uint uVar5;
  REF_BOOL RVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  REF_INT new_cell;
  REF_INT nnode1;
  REF_INT nnode0;
  REF_INT nodes [27];
  REF_INT node_list1 [1000];
  REF_INT node_list0 [1000];
  uint local_2020;
  int local_201c;
  REF_GRID local_2018;
  uint local_2010;
  int local_200c;
  REF_BOOL *local_2008;
  ulong local_2000;
  int local_1ff8 [4];
  REF_INT local_1fe8 [28];
  REF_INT local_1f78 [1000];
  REF_INT local_fd8 [1002];
  
  *allowed = 0;
  pRVar2 = ref_grid->cell[8];
  uVar13 = 0xffffffff;
  if (-1 < node1) {
    uVar13 = 0xffffffff;
    if (node1 < pRVar2->ref_adj->nnode) {
      uVar13 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node1];
    }
  }
  local_2018 = ref_grid;
  local_2008 = allowed;
  if ((int)uVar13 != -1) {
    RVar10 = pRVar2->ref_adj->item[(int)uVar13].ref;
    do {
      uVar4 = ref_cell_nodes(pRVar2,RVar10,local_1fe8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1c9,"ref_collapse_edge_manifold",(ulong)uVar4);
        return uVar4;
      }
      if ((long)pRVar2->node_per < 1) {
LAB_001632a2:
        if (0 < pRVar2->node_per) {
          lVar7 = 0;
          do {
            if (local_1fe8[lVar7] == node1) {
              local_1fe8[lVar7] = node0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        uVar4 = ref_cell_with(pRVar2,local_1fe8,&local_201c);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x1d4,"ref_collapse_edge_manifold",(ulong)uVar4);
          local_2020 = uVar4;
        }
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return local_2020;
        }
        if (local_201c != -1) goto LAB_001638df;
      }
      else {
        lVar7 = 0;
        bVar14 = false;
        do {
          if (local_1fe8[lVar7] == node0) {
            bVar14 = true;
          }
          lVar7 = lVar7 + 1;
        } while (pRVar2->node_per != lVar7);
        if (!bVar14) goto LAB_001632a2;
      }
      pRVar3 = pRVar2->ref_adj->item;
      iVar1 = pRVar3[(int)uVar13].next;
      uVar13 = (ulong)iVar1;
      if (uVar13 == 0xffffffffffffffff) {
        RVar10 = -1;
      }
      else {
        RVar10 = pRVar3[uVar13].ref;
      }
    } while (iVar1 != -1);
  }
  pRVar2 = local_2018->cell[3];
  uVar13 = 0xffffffff;
  if (-1 < node1) {
    uVar13 = 0xffffffff;
    if (node1 < pRVar2->ref_adj->nnode) {
      uVar13 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar13 != -1) {
    RVar10 = pRVar2->ref_adj->item[(int)uVar13].ref;
    do {
      uVar4 = ref_cell_nodes(pRVar2,RVar10,local_1fe8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1de,"ref_collapse_edge_manifold",(ulong)uVar4);
        return uVar4;
      }
      if ((long)pRVar2->node_per < 1) {
LAB_0016341e:
        if (0 < pRVar2->node_per) {
          lVar7 = 0;
          do {
            if (local_1fe8[lVar7] == node1) {
              local_1fe8[lVar7] = node0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        uVar4 = ref_cell_with(pRVar2,local_1fe8,&local_201c);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x1e9,"ref_collapse_edge_manifold",(ulong)uVar4);
          local_2020 = uVar4;
        }
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return local_2020;
        }
        if (local_201c != -1) goto LAB_001638df;
      }
      else {
        lVar7 = 0;
        bVar14 = false;
        do {
          if (local_1fe8[lVar7] == node0) {
            bVar14 = true;
          }
          lVar7 = lVar7 + 1;
        } while (pRVar2->node_per != lVar7);
        if (!bVar14) goto LAB_0016341e;
      }
      pRVar3 = pRVar2->ref_adj->item;
      iVar1 = pRVar3[(int)uVar13].next;
      uVar13 = (ulong)iVar1;
      if (uVar13 == 0xffffffffffffffff) {
        RVar10 = -1;
      }
      else {
        RVar10 = pRVar3[uVar13].ref;
      }
    } while (iVar1 != -1);
  }
  pRVar2 = local_2018->cell[3];
  local_1ff8[0] = -1;
  local_1ff8[1] = 0xffffffff;
  local_1ff8[2] = 0xffffffff;
  local_1ff8[3] = 0xffffffff;
  uVar13 = 0xffffffff;
  if (-1 < node1) {
    uVar13 = 0xffffffff;
    if (node1 < pRVar2->ref_adj->nnode) {
      uVar13 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar13 == -1) {
    uVar4 = 0;
  }
  else {
    RVar10 = pRVar2->ref_adj->item[(int)uVar13].ref;
    uVar4 = 0;
    do {
      local_2000 = uVar13;
      uVar5 = ref_cell_nodes(pRVar2,RVar10,local_1fe8);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x201,"ref_collapse_edge_manifold",(ulong)uVar5);
        local_2020 = uVar5;
        goto LAB_0016374e;
      }
      lVar7 = (long)pRVar2->node_per;
      bVar14 = false;
      if (0 < lVar7) {
        lVar8 = 0;
        bVar14 = false;
        do {
          if (local_1fe8[lVar8] == node0) {
            bVar14 = true;
          }
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if ((bVar14) && (0 < pRVar2->node_per)) {
        lVar8 = 0;
        do {
          if ((int)uVar4 < 1) {
LAB_001635f3:
            if (3 < (int)uVar4) {
              pcVar11 = "more than four remove tri nodes";
              uVar9 = 0x20d;
              goto LAB_0016365e;
            }
            local_1ff8[(int)uVar4] = local_1fe8[lVar8];
            uVar4 = uVar4 + 1;
          }
          else {
            uVar13 = 0;
            bVar14 = false;
            do {
              bVar15 = !bVar14;
              bVar14 = true;
              if (bVar15) {
                bVar14 = local_1fe8[lVar8] == local_1ff8[uVar13];
              }
              uVar13 = uVar13 + 1;
            } while (uVar4 != uVar13);
            if (!bVar14) goto LAB_001635f3;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar7);
      }
      pRVar3 = pRVar2->ref_adj->item;
      iVar1 = pRVar3[(int)local_2000].next;
      uVar13 = (ulong)iVar1;
      if (uVar13 == 0xffffffffffffffff) {
        RVar10 = -1;
      }
      else {
        RVar10 = pRVar3[uVar13].ref;
      }
    } while (iVar1 != -1);
  }
  if ((uVar4 < 5) && ((0x19U >> (uVar4 & 0x1f) & 1) != 0)) {
    bVar14 = true;
    if (uVar4 - 3 < 2) {
      uVar5 = ref_cell_node_list_around(pRVar2,node0,1000,&local_200c,local_fd8);
      if (uVar5 == 0) {
        uVar5 = ref_cell_node_list_around(pRVar2,node1,1000,(REF_INT *)&local_2010,local_1f78);
        if (uVar5 == 0) {
          if (0 < (long)local_200c) {
            lVar7 = 0;
            do {
              if (0 < (int)local_2010) {
                uVar13 = 0;
                do {
                  if (local_fd8[lVar7] == local_1f78[uVar13]) {
                    if (0 < (int)uVar4) {
                      bVar15 = true;
                      uVar12 = 0;
                      do {
                        if (bVar15) {
                          bVar15 = local_fd8[lVar7] != local_1ff8[uVar12];
                        }
                        else {
                          bVar15 = false;
                        }
                        uVar12 = uVar12 + 1;
                      } while (uVar4 != uVar12);
                      if (!bVar15) goto LAB_00163985;
                    }
                    *local_2008 = 0;
                    bVar14 = false;
                    local_2020 = 0;
                    goto LAB_00163751;
                  }
LAB_00163985:
                  uVar13 = uVar13 + 1;
                } while (uVar13 != local_2010);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != local_200c);
          }
          goto LAB_00163751;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x21d);
        local_2020 = uVar5;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x21a,"ref_collapse_edge_manifold",(ulong)uVar5);
        local_2020 = uVar5;
      }
LAB_0016374e:
      bVar14 = false;
    }
  }
  else {
    pcVar11 = "nsafe not 3-non manifold or 4-manifold";
    uVar9 = 0x215;
LAB_0016365e:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar9,"ref_collapse_edge_manifold",pcVar11);
    local_2020 = 1;
  }
LAB_00163751:
  if (!bVar14) {
    return local_2020;
  }
  pRVar2 = local_2018->cell[0];
  uVar13 = 0xffffffff;
  if (-1 < node1) {
    uVar13 = 0xffffffff;
    if (node1 < pRVar2->ref_adj->nnode) {
      uVar13 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar13 != -1) {
    RVar10 = pRVar2->ref_adj->item[(int)uVar13].ref;
    do {
      uVar4 = ref_cell_nodes(pRVar2,RVar10,local_1fe8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x232,"ref_collapse_edge_manifold",(ulong)uVar4,"nodes");
        return uVar4;
      }
      if ((long)pRVar2->node_per < 1) {
LAB_00163823:
        if (0 < pRVar2->node_per) {
          lVar7 = 0;
          do {
            if (local_1fe8[lVar7] == node1) {
              local_1fe8[lVar7] = node0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        uVar4 = ref_cell_with(pRVar2,local_1fe8,&local_201c);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x23d,"ref_collapse_edge_manifold",(ulong)uVar4,"with node0 failed");
          local_2020 = uVar4;
        }
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return local_2020;
        }
        if (local_201c != -1) goto LAB_001638df;
      }
      else {
        lVar7 = 0;
        bVar14 = false;
        do {
          if (local_1fe8[lVar7] == node0) {
            bVar14 = true;
          }
          lVar7 = lVar7 + 1;
        } while (pRVar2->node_per != lVar7);
        if (!bVar14) goto LAB_00163823;
      }
      pRVar3 = pRVar2->ref_adj->item;
      iVar1 = pRVar3[(int)uVar13].next;
      uVar13 = (ulong)iVar1;
      if (uVar13 == 0xffffffffffffffff) {
        RVar10 = -1;
      }
      else {
        RVar10 = pRVar3[uVar13].ref;
      }
    } while (iVar1 != -1);
  }
  RVar6 = 1;
LAB_001638e1:
  *local_2008 = RVar6;
  return 0;
LAB_001638df:
  RVar6 = 0;
  goto LAB_001638e1;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_manifold(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, new_cell;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  { /* ensure the tri node neighbors shared by node0 and node1 are
       involved in the collapse (i.e. there are no new connections to
       created) */
    REF_INT safe_list[4], nsafe;
    REF_INT nnode0, node_list0[MAX_NODE_LIST];
    REF_INT nnode1, node_list1[MAX_NODE_LIST];
    REF_INT i, i0, i1;
    REF_BOOL already_have_it, shared;

    nsafe = 0;
    safe_list[0] = REF_EMPTY;
    safe_list[1] = REF_EMPTY;
    safe_list[2] = REF_EMPTY;
    safe_list[3] = REF_EMPTY;
    each_ref_cell_having_node(ref_cell, node1, item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

      will_be_collapsed = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
      if (will_be_collapsed) {
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          already_have_it = REF_FALSE;
          for (i = 0; i < nsafe; i++) {
            already_have_it = already_have_it || (nodes[node] == safe_list[i]);
          }
          if (!already_have_it) {
            RAS(nsafe < 4, "more than four remove tri nodes");
            safe_list[nsafe] = nodes[node];
            nsafe++;
          }
        }
      }
    }
    RAS(0 == nsafe || 3 == nsafe || 4 == nsafe,
        "nsafe not 3-non manifold or 4-manifold");

    if (3 == nsafe || 4 == nsafe) {
      RSS(ref_cell_node_list_around(ref_cell, node0, MAX_NODE_LIST, &nnode0,
                                    node_list0),
          "node0 list");
      RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode1,
                                    node_list1),
          "node1 list");
      for (i0 = 0; i0 < nnode0; i0++) {
        for (i1 = 0; i1 < nnode1; i1++) {
          if (node_list0[i0] == node_list1[i1]) {
            shared = REF_TRUE;
            for (i = 0; i < nsafe; i++) {
              shared = shared && (node_list0[i0] != safe_list[i]);
            }
            if (shared) {
              *allowed = REF_FALSE;
              return REF_SUCCESS;
            }
          }
        }
      }
    }
  }

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}